

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.hh
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MC::MC_Parser::value_type::emplace<std::__cxx11::string,std::__cxx11::string>
          (value_type *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_local;
  value_type *this_local;
  
  if (this->yytypeid_ != (type_info *)0x0) {
    __assert_fail("!yytypeid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/build_O0/mc_parser.tab.hh"
                  ,0x109,
                  "T &MC::MC_Parser::value_type::emplace(U &&...) [T = std::basic_string<char>, U = <std::basic_string<char>>]"
                 );
  }
  this->yytypeid_ = (type_info *)&std::__cxx11::string::typeinfo;
  this_00 = yyas_<std::__cxx11::string>(this);
  std::__cxx11::string::string((string *)this_00,(string *)u);
  return this_00;
}

Assistant:

T&
    emplace (U&&... u)
    {
      YY_ASSERT (!yytypeid_);
      YY_ASSERT (sizeof (T) <= size);
      yytypeid_ = & typeid (T);
      return *new (yyas_<T> ()) T (std::forward <U>(u)...);
    }